

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigCuts.c
# Opt level: O2

int Aig_ManCutCount(Aig_ManCut_t *p,int *pnCutsK)

{
  Vec_Ptr_t *p_00;
  void *pvVar1;
  Aig_Cut_t *pAVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int i;
  bool bVar6;
  
  iVar4 = 0;
  iVar5 = 0;
  for (i = 0; p_00 = p->pAig->vObjs, i < p_00->nSize; i = i + 1) {
    pvVar1 = Vec_PtrEntry(p_00,i);
    if ((pvVar1 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar1 + 0x18) & 7) - 7)) {
      pAVar2 = p->pCuts[*(int *)((long)pvVar1 + 0x24)];
      iVar3 = p->nCutsMax;
      if (p->nCutsMax < 1) {
        iVar3 = 0;
      }
      while (bVar6 = iVar3 != 0, iVar3 = iVar3 + -1, bVar6) {
        if (pAVar2->nFanins != '\0') {
          iVar4 = iVar4 + 1;
          iVar5 = iVar5 + (uint)(p->nLeafMax == (int)pAVar2->nFanins);
        }
        pAVar2 = (Aig_Cut_t *)((long)&pAVar2->pNext + (long)pAVar2->nCutSize);
      }
    }
  }
  if (pnCutsK != (int *)0x0) {
    *pnCutsK = iVar5;
  }
  return iVar4;
}

Assistant:

int Aig_ManCutCount( Aig_ManCut_t * p, int * pnCutsK )
{
    Aig_Cut_t * pCut;
    Aig_Obj_t * pObj;
    int i, k, nCuts = 0, nCutsK = 0;
    Aig_ManForEachNode( p->pAig, pObj, i )
        Aig_ObjForEachCut( p, pObj, pCut, k )
        {
            if ( pCut->nFanins == 0 )
                continue;
            nCuts++;
            if ( pCut->nFanins == p->nLeafMax )
                nCutsK++;
        }
    if ( pnCutsK )
        *pnCutsK = nCutsK;
    return nCuts;
}